

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O0

void __thiscall polyscope::CurveNetwork::buildCustomUI(CurveNetwork *this)

{
  bool bVar1;
  float *col;
  size_t sVar2;
  vec<3,_float,_(glm::qualifier)0> *this_00;
  ScaledValue<float> *this_01;
  CurveNetwork *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [56];
  vec3 vVar5;
  char *in_stack_ffffffffffffffc8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_ffffffffffffffe0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_ffffffffffffffe4;
  undefined1 auVar3 [64];
  
  auVar4 = in_ZMM0._8_56_;
  col = (float *)nNodes((CurveNetwork *)0x4ae6a8);
  sVar2 = nEdges((CurveNetwork *)0x4ae6b6);
  ImGui::Text("nodes: %lld  edges: %lld",col,sVar2);
  this_00 = PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::get(&in_RDI->color);
  glm::vec<3,_float,_(glm::qualifier)0>::operator[](this_00,0);
  bVar1 = ImGui::ColorEdit3((char *)in_RDI,col,0);
  if (bVar1) {
    vVar5 = getColor(in_RDI);
    in_stack_ffffffffffffffd0 = vVar5.field_2;
    auVar3._0_8_ = vVar5._0_8_;
    auVar3._8_56_ = auVar4;
    in_stack_ffffffffffffffc8 = (char *)vmovlpd_avx(auVar3._0_16_);
    in_stack_ffffffffffffffd8 = SUB84(in_stack_ffffffffffffffc8,0);
    in_stack_ffffffffffffffdc = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    vVar5.field_1.y = in_stack_ffffffffffffffd0.z;
    vVar5.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)in_stack_ffffffffffffffdc;
    vVar5.field_2 = in_stack_ffffffffffffffe4;
    in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffd0;
    setColor(in_RDI,vVar5);
  }
  ImGui::SameLine((float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
  ImGui::PushItemWidth(in_stack_ffffffffffffffd4);
  this_01 = PersistentValue<polyscope::ScaledValue<float>_>::get(&in_RDI->radius);
  ScaledValue<float>::getValuePtr(this_01);
  bVar1 = ImGui::SliderFloat((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                             (float *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.z,
                             in_stack_ffffffffffffffc8,(ImGuiSliderFlags)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    PersistentValue<polyscope::ScaledValue<float>_>::manuallyChanged
              ((PersistentValue<polyscope::ScaledValue<float>_> *)in_RDI);
    requestRedraw();
  }
  ImGui::PopItemWidth();
  return;
}

Assistant:

void CurveNetwork::buildCustomUI() {
  ImGui::Text("nodes: %lld  edges: %lld", static_cast<long long int>(nNodes()), static_cast<long long int>(nEdges()));
  if (ImGui::ColorEdit3("Color", &color.get()[0], ImGuiColorEditFlags_NoInputs)) {
    setColor(getColor());
  }
  ImGui::SameLine();
  ImGui::PushItemWidth(100);
  if (ImGui::SliderFloat("Radius", radius.get().getValuePtr(), 0.0, .1, "%.5f",
                         ImGuiSliderFlags_Logarithmic | ImGuiSliderFlags_NoRoundToFormat)) {
    radius.manuallyChanged();
    requestRedraw();
  }
  ImGui::PopItemWidth();
}